

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KB.cpp
# Opt level: O1

bool __thiscall
components::KnowledgeBase::get_specific_percept_info
          (KnowledgeBase *this,pair<int,_int> room,constraint specific_knowledge)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  mapped_type *pmVar6;
  pair<int,_int> local_8;
  
  if (pit < specific_knowledge) {
    bVar1 = 0;
    goto LAB_00108383;
  }
  local_8 = room;
  switch(specific_knowledge) {
  case stench:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    bVar1 = pmVar6->stench;
    goto LAB_00108383;
  case breeze:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    uVar3 = pmVar6->breeze;
    bVar1 = uVar3;
    break;
  case glitter:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    uVar4 = pmVar6->glitter;
    bVar1 = uVar4;
    break;
  case bump:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    uVar5 = pmVar6->bump;
    bVar1 = uVar5;
    break;
  case scream:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    uVar2 = pmVar6->scream;
    bVar1 = uVar2;
    break;
  case wumpus:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    bVar1 = pmVar6->wumpus;
    break;
  case pit:
    pmVar6 = std::
             map<std::pair<int,_int>,_DataStructures::Knowledge,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_DataStructures::Knowledge>_>_>
             ::operator[](&this->data,&local_8);
    bVar1 = pmVar6->pit;
    goto LAB_00108383;
  }
  bVar1 = bVar1 & 1;
LAB_00108383:
  return (bool)(bVar1 & 1);
}

Assistant:

bool KnowledgeBase::get_specific_percept_info(std::pair<int, int> room, DataStructures::constraint specific_knowledge){
        if(specific_knowledge == DataStructures::constraint::breeze) return KnowledgeBase::get_information_breeze(room);
        else if(specific_knowledge == DataStructures::constraint::bump) return KnowledgeBase::get_information_bump(room);
        else if(specific_knowledge == DataStructures::constraint::glitter) return KnowledgeBase::get_information_glitter(room);
        else if(specific_knowledge == DataStructures::constraint::pit) return KnowledgeBase::get_information_pit(room);
        else if(specific_knowledge == DataStructures::constraint::scream) return KnowledgeBase::get_information_scream(room);
        else if(specific_knowledge == DataStructures::constraint::stench) return KnowledgeBase::get_information_stench(room);
        else if(specific_knowledge == DataStructures::constraint::wumpus) return KnowledgeBase::get_information_wumpus(room);
        else return false;
    }